

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_triangle_lines(rf_vec2 v1,rf_vec2 v2,rf_vec2 v3,rf_color color)

{
  _Bool _Var1;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 uStack_54;
  
  _Var1 = rf_gfx_check_buffer_limit(6);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  local_58 = v1.x;
  uStack_54 = v1.y;
  rf_gfx_vertex2f(local_58,uStack_54);
  local_78 = v2.x;
  uStack_74 = v2.y;
  rf_gfx_vertex2f(local_78,uStack_74);
  rf_gfx_vertex2f(local_78,uStack_74);
  local_68 = v3.x;
  uStack_64 = v3.y;
  rf_gfx_vertex2f(local_68,uStack_64);
  rf_gfx_vertex2f(local_68,uStack_64);
  rf_gfx_vertex2f(local_58,uStack_54);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_triangle_lines(rf_vec2 v1, rf_vec2 v2, rf_vec2 v3, rf_color color)
{
    if (rf_gfx_check_buffer_limit(6)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(v1.x, v1.y);
    rf_gfx_vertex2f(v2.x, v2.y);

    rf_gfx_vertex2f(v2.x, v2.y);
    rf_gfx_vertex2f(v3.x, v3.y);

    rf_gfx_vertex2f(v3.x, v3.y);
    rf_gfx_vertex2f(v1.x, v1.y);
    rf_gfx_end();
}